

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cc
# Opt level: O1

void board::bitboard::print(uint64_t bb)

{
  int i;
  uint uVar1;
  char *pcVar2;
  
  uVar1 = 0;
  do {
    if ((uVar1 & 7) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
    }
    pcVar2 = "X";
    if ((bb & 1) == 0) {
      pcVar2 = "-";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,1);
    bb = bb >> 1;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void board::bitboard::print(uint64_t bb)
{
    for (int i = 0; i < 64; i++) {
        if (i % 8 == 0) {
            std::cout << std::endl;
        }
        if (bb & 1ULL) {
            std::cout << "X";
        }
        else {
            std::cout << "-";
        }
        bb = bb >> 1;
    }
    std::cout << std::endl;
}